

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigObj.c
# Opt level: O3

Aig_Obj_t * Aig_ObjCreateCo(Aig_Man_t *p,Aig_Obj_t *pDriver)

{
  uint uVar1;
  int iVar2;
  Vec_Ptr_t *pVVar3;
  Aig_Obj_t *pObj;
  void **ppvVar4;
  
  pObj = (Aig_Obj_t *)Aig_MmFixedEntryFetch(p->pMemObjs);
  (pObj->field_0).pNext = (Aig_Obj_t *)0x0;
  pObj->pFanin0 = (Aig_Obj_t *)0x0;
  pObj->pFanin1 = (Aig_Obj_t *)0x0;
  *(undefined8 *)&pObj->field_0x18 = 0;
  pObj->TravId = 0;
  pObj->Id = 0;
  (pObj->field_5).pData = (void *)0x0;
  pVVar3 = p->vObjs;
  uVar1 = pVVar3->nSize;
  pObj->Id = uVar1;
  if (uVar1 == pVVar3->nCap) {
    if ((int)uVar1 < 0x10) {
      if (pVVar3->pArray == (void **)0x0) {
        ppvVar4 = (void **)malloc(0x80);
      }
      else {
        ppvVar4 = (void **)realloc(pVVar3->pArray,0x80);
      }
      pVVar3->pArray = ppvVar4;
      pVVar3->nCap = 0x10;
    }
    else {
      if (pVVar3->pArray == (void **)0x0) {
        ppvVar4 = (void **)malloc((ulong)uVar1 << 4);
      }
      else {
        ppvVar4 = (void **)realloc(pVVar3->pArray,(ulong)uVar1 << 4);
      }
      pVVar3->pArray = ppvVar4;
      pVVar3->nCap = uVar1 * 2;
    }
  }
  else {
    ppvVar4 = pVVar3->pArray;
  }
  iVar2 = pVVar3->nSize;
  pVVar3->nSize = iVar2 + 1;
  ppvVar4[iVar2] = pObj;
  *(ulong *)&pObj->field_0x18 = *(ulong *)&pObj->field_0x18 & 0xfffffffffffffff8 | 3;
  pVVar3 = p->vCos;
  uVar1 = pVVar3->nSize;
  if (uVar1 == pVVar3->nCap) {
    if ((int)uVar1 < 0x10) {
      if (pVVar3->pArray == (void **)0x0) {
        ppvVar4 = (void **)malloc(0x80);
      }
      else {
        ppvVar4 = (void **)realloc(pVVar3->pArray,0x80);
      }
      pVVar3->pArray = ppvVar4;
      pVVar3->nCap = 0x10;
    }
    else {
      if (pVVar3->pArray == (void **)0x0) {
        ppvVar4 = (void **)malloc((ulong)uVar1 << 4);
      }
      else {
        ppvVar4 = (void **)realloc(pVVar3->pArray,(ulong)uVar1 << 4);
      }
      pVVar3->pArray = ppvVar4;
      pVVar3->nCap = uVar1 * 2;
    }
  }
  else {
    ppvVar4 = pVVar3->pArray;
  }
  iVar2 = pVVar3->nSize;
  pVVar3->nSize = iVar2 + 1;
  ppvVar4[iVar2] = pObj;
  Aig_ObjConnect(p,pObj,pDriver,(Aig_Obj_t *)0x0);
  p->nObjs[3] = p->nObjs[3] + 1;
  return pObj;
}

Assistant:

Aig_Obj_t * Aig_ObjCreateCo( Aig_Man_t * p, Aig_Obj_t * pDriver )
{
    Aig_Obj_t * pObj;
    pObj = Aig_ManFetchMemory( p );
    pObj->Type = AIG_OBJ_CO;
    Vec_PtrPush( p->vCos, pObj );
    Aig_ObjConnect( p, pObj, pDriver, NULL );
    p->nObjs[AIG_OBJ_CO]++;
    return pObj;
}